

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_bytein(opj_mqc_t *mqc)

{
  uint c;
  opj_mqc_t *mqc_local;
  
  if (mqc->bp == mqc->end) {
    mqc->c = mqc->c + 0xff00;
    mqc->ct = 8;
  }
  else {
    if (mqc->bp + 1 == mqc->end) {
      c = 0xff;
    }
    else {
      c = (uint)mqc->bp[1];
    }
    if (*mqc->bp == 0xff) {
      if (c < 0x90) {
        mqc->bp = mqc->bp + 1;
        mqc->c = c * 0x200 + mqc->c;
        mqc->ct = 7;
      }
      else {
        mqc->c = mqc->c + 0xff00;
        mqc->ct = 8;
      }
    }
    else {
      mqc->bp = mqc->bp + 1;
      mqc->c = c * 0x100 + mqc->c;
      mqc->ct = 8;
    }
  }
  return;
}

Assistant:

static void mqc_bytein(opj_mqc_t *const mqc) {
	if (mqc->bp != mqc->end) {
		unsigned int c;
		if (mqc->bp + 1 != mqc->end) {
			c = *(mqc->bp + 1);
		} else {
			c = 0xff;
		}
		if (*mqc->bp == 0xff) {
			if (c > 0x8f) {
				mqc->c += 0xff00;
				mqc->ct = 8;
			} else {
				mqc->bp++;
				mqc->c += c << 9;
				mqc->ct = 7;
			}
		} else {
			mqc->bp++;
			mqc->c += c << 8;
			mqc->ct = 8;
		}
	} else {
		mqc->c += 0xff00;
		mqc->ct = 8;
	}
}